

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_ul_setup(Curl_easy *data,_Bool sizechecked)

{
  connectdata *pcVar1;
  FILEPROTO *pFVar2;
  CURLcode CVar3;
  size_t sVar4;
  char *fmt;
  bool bVar5;
  ulong local_60;
  size_t actuallyread;
  size_t readthisamountnow;
  curl_off_t passed;
  int seekerr;
  _Bool append;
  ftp_conn *ftpc;
  FTP *ftp;
  connectdata *conn;
  CURLcode result;
  _Bool sizechecked_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  pFVar2 = (data->req).p.file;
  bVar5 = (*(ulong *)&(data->set).field_0x8e2 >> 8 & 1) != 0;
  if ((((data->state).resume_from != 0) && (!sizechecked)) ||
     ((0 < (data->state).resume_from && (sizechecked)))) {
    passed._0_4_ = 0;
    if ((data->state).resume_from < 0) {
      CVar3 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"SIZE %s",(pcVar1->proto).ftpc.file);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      _state(data,FTP_STOR_SIZE);
      return CURLE_OK;
    }
    bVar5 = true;
    if (pcVar1->seek_func != (curl_seek_callback)0x0) {
      Curl_set_in_callback(data,true);
      passed._0_4_ = (*pcVar1->seek_func)(pcVar1->seek_client,(data->state).resume_from,0);
      Curl_set_in_callback(data,false);
    }
    if ((int)passed != 0) {
      readthisamountnow = 0;
      if ((int)passed != 2) {
        Curl_failf(data,"Could not seek stream");
        return CURLE_FTP_COULDNT_USE_REST;
      }
      do {
        if ((long)(ulong)(data->set).buffer_size <
            (long)((data->state).resume_from - readthisamountnow)) {
          local_60 = (ulong)(data->set).buffer_size;
        }
        else {
          local_60 = curlx_sotouz((data->state).resume_from - readthisamountnow);
        }
        sVar4 = (*(data->state).fread_func)((data->state).buffer,1,local_60,(data->state).in);
        readthisamountnow = sVar4 + readthisamountnow;
        if ((sVar4 == 0) || (local_60 < sVar4)) {
          Curl_failf(data,"Failed to read data");
          return CURLE_FTP_COULDNT_USE_REST;
        }
      } while ((long)readthisamountnow < (data->state).resume_from);
    }
    if ((0 < (data->state).infilesize) &&
       ((data->state).infilesize = (data->state).infilesize - (data->state).resume_from,
       (data->state).infilesize < 1)) {
      Curl_infof(data,"File already completely uploaded");
      Curl_setup_transfer(data,-1,-1,false,-1);
      pFVar2->fd = 2;
      _state(data,FTP_STOP);
      return CURLE_OK;
    }
  }
  fmt = "STOR %s";
  if (bVar5) {
    fmt = "APPE %s";
  }
  CVar3 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,fmt,(pcVar1->proto).ftpc.file);
  if (CVar3 == CURLE_OK) {
    _state(data,FTP_STOR);
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_state_ul_setup(struct Curl_easy *data,
                                   bool sizechecked)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool append = data->set.remote_append;

  if((data->state.resume_from && !sizechecked) ||
     ((data->state.resume_from > 0) && sizechecked)) {
    /* we're about to continue the uploading of a file */
    /* 1. get already existing file's size. We use the SIZE command for this
       which may not exist in the server!  The SIZE command is not in
       RFC959. */

    /* 2. This used to set REST. But since we can do append, we
       don't another ftp command. We just skip the source file
       offset and then we APPEND the rest on the file instead */

    /* 3. pass file-size number of bytes in the source file */
    /* 4. lower the infilesize counter */
    /* => transfer as usual */
    int seekerr = CURL_SEEKFUNC_OK;

    if(data->state.resume_from < 0) {
      /* Got no given size to start from, figure it out */
      result = Curl_pp_sendf(data, &ftpc->pp, "SIZE %s", ftpc->file);
      if(!result)
        state(data, FTP_STOR_SIZE);
      return result;
    }

    /* enable append */
    append = TRUE;

    /* Let's read off the proper amount of bytes from the input. */
    if(conn->seek_func) {
      Curl_set_in_callback(data, true);
      seekerr = conn->seek_func(conn->seek_client, data->state.resume_from,
                                SEEK_SET);
      Curl_set_in_callback(data, false);
    }

    if(seekerr != CURL_SEEKFUNC_OK) {
      curl_off_t passed = 0;
      if(seekerr != CURL_SEEKFUNC_CANTSEEK) {
        failf(data, "Could not seek stream");
        return CURLE_FTP_COULDNT_USE_REST;
      }
      /* seekerr == CURL_SEEKFUNC_CANTSEEK (can't seek to offset) */
      do {
        size_t readthisamountnow =
          (data->state.resume_from - passed > data->set.buffer_size) ?
          (size_t)data->set.buffer_size :
          curlx_sotouz(data->state.resume_from - passed);

        size_t actuallyread =
          data->state.fread_func(data->state.buffer, 1, readthisamountnow,
                                 data->state.in);

        passed += actuallyread;
        if((actuallyread == 0) || (actuallyread > readthisamountnow)) {
          /* this checks for greater-than only to make sure that the
             CURL_READFUNC_ABORT return code still aborts */
          failf(data, "Failed to read data");
          return CURLE_FTP_COULDNT_USE_REST;
        }
      } while(passed < data->state.resume_from);
    }
    /* now, decrease the size of the read */
    if(data->state.infilesize>0) {
      data->state.infilesize -= data->state.resume_from;

      if(data->state.infilesize <= 0) {
        infof(data, "File already completely uploaded");

        /* no data to transfer */
        Curl_setup_transfer(data, -1, -1, FALSE, -1);

        /* Set ->transfer so that we won't get any error in
         * ftp_done() because we didn't transfer anything! */
        ftp->transfer = PPTRANSFER_NONE;

        state(data, FTP_STOP);
        return CURLE_OK;
      }
    }
    /* we've passed, proceed as normal */
  } /* resume_from */

  result = Curl_pp_sendf(data, &ftpc->pp, append?"APPE %s":"STOR %s",
                         ftpc->file);
  if(!result)
    state(data, FTP_STOR);

  return result;
}